

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O3

void print_key_file(econf_file key_file)

{
  long lVar1;
  undefined8 *puVar2;
  long in_stack_00000008;
  long in_stack_00000010;
  
  puts("----------------------------------");
  printf("path: %s\n",key_file.length);
  printf("delimiter: %c, comment: %c\n",(ulong)(uint)(int)(char)key_file.file_entry,
         (ulong)(uint)(int)key_file.file_entry._1_1_);
  puts("values:");
  if (in_stack_00000010 != 0) {
    puVar2 = (undefined8 *)(in_stack_00000008 + 0x20);
    lVar1 = in_stack_00000010;
    do {
      printf("  group: %s ; key: %s ; value: %s ; pre_comment %s ; added_comment: %s\n",puVar2[-4],
             puVar2[-3],puVar2[-2],puVar2[-1],*puVar2);
      puVar2 = puVar2 + 7;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  puts("----------------------------------");
  return;
}

Assistant:

void print_key_file(const econf_file key_file)
{
  printf("----------------------------------\n");
  printf("path: %s\n", key_file.path);
  printf("delimiter: %c, comment: %c\n", key_file.delimiter, key_file.comment);
  printf("values:\n");
  for(size_t i = 0; i < key_file.length; i++)
  {
    printf("  group: %s ; key: %s ; value: %s ; pre_comment %s ; added_comment: %s\n",
	   key_file.file_entry[i].group,
	   key_file.file_entry[i].key,
	   key_file.file_entry[i].value,
	   key_file.file_entry[i].comment_before_key,
	   key_file.file_entry[i].comment_after_value
	   );
  }
  printf("----------------------------------\n");
}